

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O1

void __thiscall
AddressFixture_InitSegment1Offset0_Test::~AddressFixture_InitSegment1Offset0_Test
          (AddressFixture_InitSegment1Offset0_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (AddressFixture, InitSegment1Offset0) {
    constexpr auto segment = pstore::address::segment_type{1};
    constexpr auto offset = pstore::address::offset_type{0};

    auto const expected = this->expected_address (segment, offset);
    constexpr auto actual = pstore::address{segment, offset};

    EXPECT_EQ (expected, actual);
    EXPECT_EQ (expected.absolute (), actual.absolute ());
    EXPECT_EQ (segment, actual.segment ());
    EXPECT_EQ (offset, actual.offset ());
}